

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstantValue.cpp
# Opt level: O1

bool __thiscall slang::ConstantRange::contains(ConstantRange *this,ConstantRange other)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  
  iVar4 = other.left;
  iVar2 = other.right;
  iVar6 = iVar4;
  if (iVar2 < iVar4) {
    iVar6 = iVar2;
  }
  iVar1 = this->left;
  iVar3 = this->right;
  iVar5 = iVar1;
  if (iVar3 < iVar1) {
    iVar5 = iVar3;
  }
  if (iVar6 < iVar5) {
    return false;
  }
  if (iVar2 < iVar4) {
    iVar2 = iVar4;
  }
  if (iVar3 < iVar1) {
    iVar3 = iVar1;
  }
  return iVar2 <= iVar3;
}

Assistant:

bool ConstantRange::contains(ConstantRange other) const {
    return other.lower() >= lower() && other.upper() <= upper();
}